

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

vec3 vec3_rotate_about_axis(vec3 vec,vec3 axis,float theta)

{
  vec3 vVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float w;
  float v;
  float u;
  float z;
  float y;
  float x;
  float s;
  float c;
  float theta_local;
  undefined4 local_40;
  undefined4 uStack_3c;
  vec3 axis_local;
  undefined4 local_20;
  undefined4 uStack_1c;
  vec3 vec_local;
  vec3 rotated_vec;
  
  fVar5 = axis.z;
  fVar4 = vec.z;
  fVar2 = cosf(theta);
  fVar3 = sinf(theta);
  local_20 = vec.x;
  uStack_1c = vec.y;
  local_40 = axis.x;
  uStack_3c = axis.y;
  vVar1.y = (fVar5 * local_20 - local_40 * fVar4) * fVar3 +
            uStack_3c * (fVar5 * fVar4 + local_40 * local_20 + uStack_3c * uStack_1c) *
            (1.0 - fVar2) + uStack_1c * fVar2;
  vVar1.x = (uStack_3c * fVar4 - fVar5 * uStack_1c) * fVar3 +
            local_40 * (fVar5 * fVar4 + local_40 * local_20 + uStack_3c * uStack_1c) * (1.0 - fVar2)
            + local_20 * fVar2;
  vVar1.z = (local_40 * uStack_1c - uStack_3c * local_20) * fVar3 +
            fVar5 * (fVar5 * fVar4 + local_40 * local_20 + uStack_3c * uStack_1c) * (1.0 - fVar2) +
            fVar4 * fVar2;
  return vVar1;
}

Assistant:

vec3 vec3_rotate_about_axis(vec3 vec, vec3 axis, float theta) {
    float c = cosf(theta);
    float s = sinf(theta);

    float x = vec.x;
    float y = vec.y;
    float z = vec.z;

    float u = axis.x;
    float v = axis.y;
    float w = axis.z;

    vec3 rotated_vec;
    rotated_vec.x = u * (u * x + v * y + w * z) * (1.0f - c) + x * c + (-w * y + v * z) * s;
    rotated_vec.y = v * (u * x + v * y + w * z) * (1.0f - c) + y * c + (w * x - u * z) * s;
    rotated_vec.z = w * (u * x + v * y + w * z) * (1.0f - c) + z * c + (-v * x + u * y) * s;
    return rotated_vec;
}